

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O3

void __thiscall lineage::SolutionGraph::saveSVG(SolutionGraph *this,string *fileName)

{
  pointer pvVar1;
  pointer puVar2;
  long lVar3;
  string *psVar4;
  pointer pVVar5;
  ostream *poVar6;
  pointer pVVar7;
  unsigned_long *node;
  pointer puVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  VertexIterator it;
  pointer pAVar14;
  vector<CellLine,_std::allocator<CellLine>_> cellLines;
  ofstream file;
  vector<CellLine,_std::allocator<CellLine>_> local_260;
  string *local_248;
  unsigned_long local_240;
  undefined1 local_238 [8];
  size_t sStack_230;
  ulong *local_228;
  _Elt_pointer puStack_220;
  _Elt_pointer local_218;
  _Map_pointer ppuStack_210;
  ulong *local_208;
  ulong *puStack_200;
  ulong *local_1f8;
  _Map_pointer ppuStack_1f0;
  ios_base local_140 [272];
  
  std::vector<CellLine,_std::allocator<CellLine>_>::vector
            (&local_260,
             (long)(this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_238);
  local_1f8 = (ulong *)0x0;
  ppuStack_1f0 = (_Map_pointer)0x0;
  local_208 = (ulong *)0x0;
  puStack_200 = (ulong *)0x0;
  local_218 = (_Elt_pointer)0x0;
  ppuStack_210 = (_Map_pointer)0x0;
  local_228 = (ulong *)0x0;
  puStack_220 = (_Elt_pointer)0x0;
  local_238 = (undefined1  [8])0x0;
  sStack_230 = 0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_238,0);
  local_240 = 0;
  pVVar5 = (this->lineageGraph_).vertices_.
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar7 = (this->lineageGraph_).vertices_.
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_248 = fileName;
  if (pVVar7 != pVVar5) {
    do {
      if (pVVar5[local_240].from_.vector_.
          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          pVVar5[local_240].from_.vector_.
          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (local_208 == local_1f8 + -1) {
          std::deque<unsigned_long,std::allocator<unsigned_long>>::
          _M_push_back_aux<unsigned_long_const&>
                    ((deque<unsigned_long,std::allocator<unsigned_long>> *)local_238,&local_240);
          pVVar5 = (this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar7 = (this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *local_208 = local_240;
          local_208 = local_208 + 1;
        }
      }
      local_240 = local_240 + 1;
    } while (local_240 < (ulong)((long)pVVar7 - (long)pVVar5 >> 6));
  }
  if (local_208 != local_228) {
    sVar9 = 0;
    do {
      if (local_208 == puStack_200) {
        uVar10 = ppuStack_1f0[-1][0x3f];
        operator_delete(puStack_200,0x200);
        puStack_200 = ppuStack_1f0[-1];
        local_1f8 = puStack_200 + 0x40;
        local_208 = puStack_200 + 0x3f;
        ppuStack_1f0 = ppuStack_1f0 + -1;
      }
      else {
        uVar10 = local_208[-1];
        local_208 = local_208 + -1;
      }
      local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10].x = sVar9;
      local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10].tMin = 0xffffffffffffffff;
      local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10].tMax = 1;
      pvVar1 = (this->nodesOfCell_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar8 = pvVar1[uVar10].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = *(pointer *)
                ((long)&pvVar1[uVar10].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (puVar8 != puVar2) {
        lVar3 = (long)(this->problemGraph_->problem_->nodes).
                      super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                      super__Vector_impl_data._M_start;
        uVar11 = 0xffffffffffffffff;
        uVar12 = 1;
        do {
          uVar13 = (ulong)*(int *)(lVar3 + *puVar8 * 0x18);
          if (uVar13 < uVar11) {
            local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10].tMin = uVar13;
            uVar11 = uVar13;
          }
          if (uVar12 < uVar13) {
            local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10].tMax = uVar13;
            uVar12 = uVar13;
          }
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar2);
      }
      pVVar5 = (this->lineageGraph_).vertices_.
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar14 = *(pointer *)
                 &pVVar5[uVar10].to_.vector_.
                  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ;
      if (*(pointer *)((long)&pVVar5[uVar10].to_.vector_ + 8) == pAVar14) {
        sVar9 = sVar9 + 1;
      }
      else {
        do {
          local_240 = pAVar14->vertex_;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_238,&local_240);
          pAVar14 = pAVar14 + 1;
        } while (pAVar14 !=
                 *(pointer *)
                  ((long)&(this->lineageGraph_).vertices_.
                          super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar10].to_.vector_ + 8));
      }
    } while (local_208 != local_228);
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_238);
  std::ofstream::ofstream(local_238,(string *)local_248,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\"?>",
             0x36);
  std::ios::widen((char)(ostream *)local_238 + (char)*(_Map_pointer)((long)local_238 + -0x18));
  std::ostream::put((char)local_238);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" ",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">",0x33);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"<svg version=\"1.1\" xmlns=\"http://www.w3.org/2000/svg\" ",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"xmlns:xlink=\"http://www.w3.org/1999/xlink\"",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_248 = (string *)0x0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"<line x1=\"",10);
      psVar4 = local_248;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," y1=\"",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," x2=\"",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," y2=\"",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>",0x31);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      uVar10 = local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
               super__Vector_impl_data._M_start[(long)psVar4].tMin;
      if (uVar10 <= local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)psVar4].tMax) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"<line x1=\"",10);
          poVar6 = std::ostream::_M_insert<double>
                             ((((double)CONCAT44(0x45300000,
                                                 (int)(local_260.
                                                                                                              
                                                  super__Vector_base<CellLine,_std::allocator<CellLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)psVar4].x >> 0x20)) -
                               1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,
                                                 (int)local_260.
                                                                                                            
                                                  super__Vector_base<CellLine,_std::allocator<CellLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)psVar4].x) - 4503599627370496.0) + -0.2) *
                              10.0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," y1=\"",5);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," x2=\"",5);
          poVar6 = std::ostream::_M_insert<double>
                             ((((double)CONCAT44(0x45300000,
                                                 (int)(local_260.
                                                                                                              
                                                  super__Vector_base<CellLine,_std::allocator<CellLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)psVar4].x >> 0x20)) -
                               1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,
                                                 (int)local_260.
                                                                                                            
                                                  super__Vector_base<CellLine,_std::allocator<CellLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)psVar4].x) - 4503599627370496.0) + 0.2) *
                              10.0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," y2=\"",5);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>",0x31);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          uVar10 = uVar10 + 1;
        } while (uVar10 <= local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl
                           .super__Vector_impl_data._M_start[(long)psVar4].tMax);
      }
      local_248 = (string *)((long)&(local_248->_M_dataplus)._M_p + 1);
    } while (local_248 <
             (string *)
             (((long)local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  if ((this->lineageGraph_).edges_.
      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->lineageGraph_).edges_.
      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"<line x1=\"",10);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," y1=\"",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," x2=\"",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," y2=\"",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," style=\"stroke:rgb(0, 153, 0); stroke-width:1pt;\"/>",0x33);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(this->lineageGraph_).edges_.
                                    super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->lineageGraph_).edges_.
                                    super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"</svg>\n",7);
  std::ofstream::close();
  local_238 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_238 + (long)_VTT[-3]) = _typeinfo;
  std::filebuf::~filebuf((filebuf *)&sStack_230);
  std::ios_base::~ios_base(local_140);
  if (local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void saveSVG(std::string const& fileName = "lineage") const
    {
        struct CellLine
        {
            size_t x;
            size_t tMin;
            size_t tMax;
        };

        std::vector<CellLine> cellLines(lineageGraph_.numberOfVertices());

        {
            std::stack<size_t> cells;

            // put all roots on the stack
            for (size_t v = 0; v < lineageGraph_.numberOfVertices(); ++v)
                if (lineageGraph_.numberOfEdgesToVertex(v) == 0)
                    cells.push(v);

            size_t xOffset = 0;
            while (!cells.empty())
            {
                auto cell = cells.top();
                cells.pop();

                cellLines[cell].x = xOffset;
                cellLines[cell].tMin = std::numeric_limits<size_t>::max();
                cellLines[cell].tMax = -std::numeric_limits<size_t>::max();

                for (auto& node : nodesOfCell_[cell])
                {
                    auto tNode = problem().nodes[node].t;
                    if (tNode < cellLines[cell].tMin)
                        cellLines[cell].tMin = tNode;
                    
                    if (tNode > cellLines[cell].tMax)
                        cellLines[cell].tMax = tNode;
                }

                if (lineageGraph_.numberOfEdgesFromVertex(cell) == 0) // if leaf
                    ++xOffset;
                else 
                    for(auto it = lineageGraph_.verticesFromVertexBegin(cell); it != lineageGraph_.verticesFromVertexEnd(cell); ++it)
                        cells.push(*it);
            }
        }

        std::ofstream file(fileName);

        // print header
        file << "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\"?>"
            << std::endl
            << "<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" "
            << "\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">"
            << std::endl
            << "<svg version=\"1.1\" xmlns=\"http://www.w3.org/2000/svg\" "
            << "xmlns:xlink=\"http://www.w3.org/1999/xlink\""
            // << " width=" << ???
            // << " height=" << ???
            << ">"
            << std::endl;

        size_t xScale = 10;
        size_t yScale = 5;
        for (size_t j = 0; j < cellLines.size(); ++j)
        {
            // draw line from (xOffset, tMin) to (xOffset, tMax)
            file << "<line x1=\"" << cellLines[j].x * xScale << "\""
                << " y1=\"" << cellLines[j].tMin * yScale<< "\""
                << " x2=\"" << cellLines[j].x * xScale << "\""
                << " y2=\"" << cellLines[j].tMax * yScale << "\""
                << " style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>"
                << std::endl;

            for (size_t t = cellLines[j].tMin; t <= cellLines[j].tMax; ++t)
                file << "<line x1=\"" << (cellLines[j].x - 0.2) * xScale << "\""
                    << " y1=\"" << t * yScale<< "\""
                    << " x2=\"" << (cellLines[j].x + 0.2) * xScale << "\""
                    << " y2=\"" << t * yScale << "\""
                    << " style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>"
                    << std::endl;
        }

        for (size_t e = 0; e < lineageGraph_.numberOfEdges(); ++e)
        {
            auto cell0 = lineageGraph_.vertexOfEdge(e, 0);
            auto cell1 = lineageGraph_.vertexOfEdge(e, 1);

            file << "<line x1=\"" << cellLines[cell0].x * xScale << "\""
                << " y1=\"" << cellLines[cell0].tMax * yScale<< "\""
                << " x2=\"" << cellLines[cell1].x * xScale << "\""
                << " y2=\"" << cellLines[cell1].tMin * yScale << "\""
                << " style=\"stroke:rgb(0, 153, 0); stroke-width:1pt;\"/>"
                << std::endl;
        }

        // print footer
        file << "</svg>\n";

        file.close();
    }